

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

void __thiscall Bitmap::drawLine(Bitmap *this,uint32_t y,uint32_t height)

{
  int32_t pixel_00;
  uint local_1c;
  uint32_t pixel;
  uint32_t i;
  uint32_t height_local;
  uint32_t y_local;
  Bitmap *this_local;
  
  if (height != 0) {
    for (local_1c = 0; local_1c < this->width; local_1c = local_1c + 1) {
      pixel_00 = getPixelIndex(this,local_1c,y);
      setPixelValue(this,pixel_00,true);
    }
    duplicateLineDown(this,y,height - 1);
  }
  return;
}

Assistant:

void Bitmap::drawLine(uint32_t y, uint32_t height)
{
   if (height > 0)
   {
      //draw horizontal line
      for (uint32_t i = 0; i < width; ++i)
      {
         uint32_t pixel = getPixelIndex(i, y);
         setPixelValue(pixel, 1);
      }
      //duplicate that line (height - 1)-times
      duplicateLineDown(y, height - 1);
   }
}